

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

LIBSSH2_COMMON_METHOD *
kex_get_method_by_name(char *name,size_t name_len,LIBSSH2_COMMON_METHOD **methodlist)

{
  int iVar1;
  size_t sVar2;
  LIBSSH2_COMMON_METHOD **local_28;
  LIBSSH2_COMMON_METHOD **methodlist_local;
  size_t name_len_local;
  char *name_local;
  
  local_28 = methodlist;
  while( true ) {
    if (*local_28 == (LIBSSH2_COMMON_METHOD *)0x0) {
      return (LIBSSH2_COMMON_METHOD *)0x0;
    }
    sVar2 = strlen((*local_28)->name);
    if ((sVar2 == name_len) && (iVar1 = strncmp((*local_28)->name,name,name_len), iVar1 == 0))
    break;
    local_28 = local_28 + 1;
  }
  return *local_28;
}

Assistant:

static const LIBSSH2_COMMON_METHOD *
kex_get_method_by_name(const char *name, size_t name_len,
                       const LIBSSH2_COMMON_METHOD ** methodlist)
{
    while (*methodlist) {
        if ((strlen((*methodlist)->name) == name_len) &&
            (strncmp((*methodlist)->name, name, name_len) == 0)) {
            return *methodlist;
        }
        methodlist++;
    }
    return NULL;
}